

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O3

cx_string<29UL> * __thiscall
mserialize::cx_strcat<15ul,3ul,1ul,3ul,1ul,3ul,2ul,1ul>
          (cx_string<29UL> *__return_storage_ptr__,mserialize *this,cx_string<15UL> *strings,
          cx_string<3UL> *strings_1,cx_string<1UL> *strings_2,cx_string<3UL> *strings_3,
          cx_string<1UL> *strings_4,cx_string<3UL> *strings_5,cx_string<2UL> *strings_6,
          cx_string<1UL> *strings_7)

{
  long lVar1;
  ulong uVar2;
  undefined8 *puVar3;
  char buffer [30];
  ulong auStack_c8 [10];
  long lStack_78;
  mserialize *local_70;
  cx_string<15UL> *local_68;
  cx_string<3UL> *local_60;
  cx_string<1UL> *local_58;
  cx_string<3UL> *local_50;
  cx_string<1UL> *local_48;
  cx_string<3UL> *pcStack_40;
  cx_string<2UL> *local_38;
  undefined8 local_28;
  undefined5 uStack_20;
  undefined1 uStack_1b;
  undefined2 uStack_1a;
  undefined5 uStack_18;
  undefined1 uStack_13;
  undefined7 uStack_12;
  
  puVar3 = &local_28;
  uStack_18 = 0;
  uStack_13 = 0;
  uStack_12 = 0;
  local_28 = 0;
  uStack_20 = 0;
  uStack_1b = 0;
  uStack_1a = 0;
  local_70 = this;
  local_68 = strings;
  local_60 = strings_1;
  local_58 = strings_2;
  local_50 = strings_3;
  local_48 = strings_4;
  pcStack_40 = strings_5;
  local_38 = strings_6;
  auStack_c8[1] = 0xf;
  auStack_c8[2] = 3;
  lVar1 = 1;
  auStack_c8[3] = 1;
  auStack_c8[4] = 3;
  auStack_c8[5] = 1;
  auStack_c8[6] = 3;
  auStack_c8[7] = 2;
  auStack_c8[8] = 1;
  do {
    if (auStack_c8[lVar1] != 0) {
      uVar2 = 0;
      do {
        *(undefined1 *)((long)puVar3 + uVar2) = *(undefined1 *)((&lStack_78)[lVar1] + uVar2);
        uVar2 = uVar2 + 1;
      } while (uVar2 < auStack_c8[lVar1]);
      puVar3 = (undefined8 *)((long)puVar3 + uVar2);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 9);
  __return_storage_ptr__->_data[0x1d] = '\0';
  *(undefined8 *)__return_storage_ptr__->_data = local_28;
  *(ulong *)(__return_storage_ptr__->_data + 8) = CONCAT26(uStack_1a,CONCAT15(uStack_1b,uStack_20));
  *(ulong *)(__return_storage_ptr__->_data + 0xd) =
       CONCAT53(uStack_18,CONCAT21(uStack_1a,uStack_1b));
  *(ulong *)(__return_storage_ptr__->_data + 0x15) = CONCAT71(uStack_12,uStack_13);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}